

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

void __thiscall crnlib::dxt_image::flip_col(dxt_image *this,uint x)

{
  element_type eVar1;
  uint8 auVar2 [8];
  char cVar3;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [14];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  unkuint9 Var27;
  undefined1 auVar28 [11];
  undefined1 auVar29 [13];
  undefined1 auVar30 [14];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  uint6 uVar33;
  dxt3_block *pdVar34;
  dxt3_block *pdVar35;
  uint bit_ofs;
  uint value;
  uint value_00;
  ulong uVar36;
  undefined8 uVar37;
  byte bVar38;
  byte bVar39;
  uint bit_ofs_1;
  int iVar40;
  uint uVar41;
  uint uVar42;
  uint x_2;
  uint x_00;
  undefined4 in_register_00000034;
  uint8 *puVar43;
  int iVar44;
  uint x_1;
  int iVar45;
  int iVar46;
  uint uVar47;
  uint uVar48;
  uint y;
  uint y_00;
  dxt3_block *this_00;
  short sVar49;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [12];
  ushort uVar63;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ulong uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  element tmp [2];
  dxt3_block local_68;
  dxt3_block local_60;
  int local_58;
  uint local_54;
  undefined8 local_50;
  ulong local_48;
  dxt_image *local_40;
  ulong local_38;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  undefined4 uVar50;
  undefined6 uVar51;
  undefined1 auVar52 [12];
  undefined1 auVar53 [14];
  undefined1 auVar56 [16];
  undefined1 auVar58 [14];
  undefined1 auVar61 [16];
  
  uVar37 = CONCAT44(in_register_00000034,x);
  uVar42 = this->m_blocks_y;
  if (uVar42 != 0) {
    iVar44 = ~x + this->m_blocks_x;
    local_48 = 0;
    local_40 = this;
    local_50 = uVar37;
    local_58 = iVar44;
    auVar67 = _DAT_001b0b70;
    auVar68 = _DAT_001ae030;
    uVar47 = this->m_num_elements_per_block;
    do {
      uVar36 = (ulong)uVar47;
      uVar48 = 0;
      if (uVar47 != 0) {
        local_38 = 0;
        do {
          iVar40 = this->m_blocks_x * (int)local_48;
          local_68.m_alpha =
               *&this->m_pElements[(uint)(((int)uVar37 + iVar40) * (int)uVar36 + (int)local_38)].
                 m_bytes;
          auVar2 = *&this->m_pElements[(uint)((iVar40 + iVar44) * (int)uVar36 + (int)local_38)].
                     m_bytes;
          local_60.m_alpha[0] = auVar2[0];
          local_60.m_alpha[1] = auVar2[1];
          local_60.m_alpha[2] = auVar2[2];
          local_60.m_alpha[3] = auVar2[3];
          local_60.m_alpha[4] = auVar2[4];
          local_60.m_alpha[5] = auVar2[5];
          local_60.m_alpha[6] = auVar2[6];
          local_60.m_alpha[7] = auVar2[7];
          uVar37 = CONCAT71(auVar2._1_7_,1);
          pdVar34 = &local_68;
          pdVar35 = &local_68;
          this_00 = &local_68;
          do {
            puVar43 = pdVar34->m_alpha + 2;
            local_54 = (uint)uVar37;
            eVar1 = this->m_element_type[local_38];
            if (eVar1 == cColorDXT1) {
              auVar54 = ZEXT416(*(uint *)(pdVar35->m_alpha + 4));
              uVar42 = 6;
              uVar36 = 0;
              do {
                bVar38 = ~(byte)(3 << ((byte)uVar42 & 0x1f));
                bVar39 = ~(byte)(3 << ((byte)uVar36 & 0x1f));
                auVar64 = pshuflw(in_XMM2,ZEXT216(CONCAT11(bVar39,bVar39)),0);
                auVar19[0xd] = 0;
                auVar19._0_13_ = auVar54._0_13_;
                auVar19[0xe] = auVar54[7];
                auVar21[0xc] = auVar54[6];
                auVar21._0_12_ = auVar54._0_12_;
                auVar21._13_2_ = auVar19._13_2_;
                auVar22[0xb] = 0;
                auVar22._0_11_ = auVar54._0_11_;
                auVar22._12_3_ = auVar21._12_3_;
                auVar23[10] = auVar54[5];
                auVar23._0_10_ = auVar54._0_10_;
                auVar23._11_4_ = auVar22._11_4_;
                auVar24[9] = 0;
                auVar24._0_9_ = auVar54._0_9_;
                auVar24._10_5_ = auVar23._10_5_;
                auVar25[8] = auVar54[4];
                auVar25._0_8_ = auVar54._0_8_;
                auVar25._9_6_ = auVar24._9_6_;
                auVar26._7_8_ = 0;
                auVar26._0_7_ = auVar25._8_7_;
                Var27 = CONCAT81(SUB158(auVar26 << 0x40,7),auVar54[3]);
                auVar31._9_6_ = 0;
                auVar31._0_9_ = Var27;
                auVar28._1_10_ = SUB1510(auVar31 << 0x30,5);
                auVar28[0] = auVar54[2];
                auVar32._11_4_ = 0;
                auVar32._0_11_ = auVar28;
                auVar29._1_12_ = SUB1512(auVar32 << 0x20,3);
                auVar29[0] = auVar54[1];
                uVar63 = (ushort)Var27;
                auVar20._10_2_ = 0;
                auVar20._0_10_ = auVar29._0_10_ << 0x10;
                auVar20._12_2_ = uVar63;
                uVar33 = CONCAT42(auVar20._10_4_,auVar28._0_2_);
                auVar30._6_8_ = 0;
                auVar30._0_6_ = uVar33;
                in_XMM2 = auVar64 & auVar54;
                auVar64._1_3_ = 0;
                auVar64[0] = auVar54[0] >> uVar36;
                uVar47 = (uint)CONCAT82(SUB148(auVar30 << 0x40,6),auVar29._0_2_);
                auVar64._4_4_ = uVar47 >> uVar36;
                uVar48 = (uint)uVar33;
                auVar64._8_4_ = uVar48 >> uVar36;
                auVar64._12_2_ = uVar63 >> uVar36;
                auVar64._14_2_ = 0;
                auVar55 = ZEXT216(CONCAT11(bVar38,bVar38));
                uVar66 = (ulong)uVar42;
                auVar59._1_3_ = 0;
                auVar59[0] = auVar54[0] >> uVar66;
                auVar59._4_4_ = uVar47 >> uVar66;
                auVar59._8_4_ = uVar48 >> uVar66;
                auVar59._12_2_ = uVar63 >> uVar66;
                auVar59._14_2_ = 0;
                auVar65 = pshuflw(auVar55,auVar55,0);
                auVar59 = auVar59 & auVar67;
                auVar60._0_4_ = auVar59._0_4_ << (int)uVar36;
                auVar60._4_4_ = auVar59._4_4_;
                auVar60._8_4_ = auVar59._8_4_;
                auVar60._12_4_ = auVar59._12_4_;
                auVar64 = auVar64 & auVar67;
                auVar60 = auVar60 & auVar68;
                sVar11 = auVar60._0_2_;
                cVar3 = (0 < sVar11) * (sVar11 < 0x100) * auVar60[0] - (0xff < sVar11);
                sVar12 = auVar60._2_2_;
                sVar49 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar60[2] - (0xff < sVar12),
                                  cVar3);
                sVar13 = auVar60._4_2_;
                cVar4 = (0 < sVar13) * (sVar13 < 0x100) * auVar60[4] - (0xff < sVar13);
                sVar14 = auVar60._6_2_;
                uVar50 = CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar60[6] - (0xff < sVar14),
                                  CONCAT12(cVar4,sVar49));
                sVar15 = auVar60._8_2_;
                cVar5 = (0 < sVar15) * (sVar15 < 0x100) * auVar60[8] - (0xff < sVar15);
                sVar16 = auVar60._10_2_;
                uVar51 = CONCAT15((0 < sVar16) * (sVar16 < 0x100) * auVar60[10] - (0xff < sVar16),
                                  CONCAT14(cVar5,uVar50));
                sVar17 = auVar60._12_2_;
                cVar6 = (0 < sVar17) * (sVar17 < 0x100) * auVar60[0xc] - (0xff < sVar17);
                sVar18 = auVar60._14_2_;
                uVar37 = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar60[0xe] - (0xff < sVar18),
                                  CONCAT16(cVar6,uVar51));
                cVar7 = (0 < sVar11) * (sVar11 < 0x100) * auVar60[0] - (0xff < sVar11);
                auVar57._0_10_ =
                     CONCAT19((0 < sVar12) * (sVar12 < 0x100) * auVar60[2] - (0xff < sVar12),
                              CONCAT18(cVar7,uVar37));
                cVar8 = (0 < sVar13) * (sVar13 < 0x100) * auVar60[4] - (0xff < sVar13);
                auVar57[10] = cVar8;
                auVar57[0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar60[6] - (0xff < sVar14);
                cVar9 = (0 < sVar15) * (sVar15 < 0x100) * auVar60[8] - (0xff < sVar15);
                auVar58[0xc] = cVar9;
                auVar58._0_12_ = auVar57;
                auVar58[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar60[10] - (0xff < sVar16);
                cVar10 = (0 < sVar17) * (sVar17 < 0x100) * auVar60[0xc] - (0xff < sVar17);
                auVar61[0xe] = cVar10;
                auVar61._0_14_ = auVar58;
                auVar61[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar60[0xe] - (0xff < sVar18);
                sVar11 = (short)((uint)uVar50 >> 0x10);
                auVar62[1] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
                auVar62[0] = (0 < sVar49) * (sVar49 < 0x100) * cVar3 - (0xff < sVar49);
                sVar12 = (short)((uint6)uVar51 >> 0x20);
                auVar62[2] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                sVar13 = (short)((ulong)uVar37 >> 0x30);
                auVar62[3] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                sVar14 = (short)((unkuint10)auVar57._0_10_ >> 0x40);
                auVar62[4] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                sVar15 = auVar57._10_2_;
                auVar62[5] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                sVar16 = auVar58._12_2_;
                auVar62[6] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                sVar17 = auVar61._14_2_;
                auVar62[7] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                auVar62[8] = (0 < sVar49) * (sVar49 < 0x100) * cVar3 - (0xff < sVar49);
                auVar62[9] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
                auVar62[10] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                auVar62[0xb] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                auVar62[0xc] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                auVar62[0xd] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                auVar62[0xe] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                auVar62[0xf] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                auVar55._0_4_ = auVar64._0_4_ << uVar42;
                auVar55._4_4_ = auVar64._4_4_;
                auVar55._8_4_ = auVar64._8_4_;
                auVar55._12_4_ = auVar64._12_4_;
                auVar55 = auVar55 & auVar68;
                sVar11 = auVar55._0_2_;
                cVar3 = (0 < sVar11) * (sVar11 < 0x100) * auVar55[0] - (0xff < sVar11);
                sVar12 = auVar55._2_2_;
                sVar49 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar55[2] - (0xff < sVar12),
                                  cVar3);
                sVar13 = auVar55._4_2_;
                cVar4 = (0 < sVar13) * (sVar13 < 0x100) * auVar55[4] - (0xff < sVar13);
                sVar14 = auVar55._6_2_;
                uVar50 = CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar55[6] - (0xff < sVar14),
                                  CONCAT12(cVar4,sVar49));
                sVar15 = auVar55._8_2_;
                cVar5 = (0 < sVar15) * (sVar15 < 0x100) * auVar55[8] - (0xff < sVar15);
                sVar16 = auVar55._10_2_;
                uVar51 = CONCAT15((0 < sVar16) * (sVar16 < 0x100) * auVar55[10] - (0xff < sVar16),
                                  CONCAT14(cVar5,uVar50));
                sVar17 = auVar55._12_2_;
                cVar6 = (0 < sVar17) * (sVar17 < 0x100) * auVar55[0xc] - (0xff < sVar17);
                sVar18 = auVar55._14_2_;
                uVar37 = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar55[0xe] - (0xff < sVar18),
                                  CONCAT16(cVar6,uVar51));
                cVar7 = (0 < sVar11) * (sVar11 < 0x100) * auVar55[0] - (0xff < sVar11);
                auVar52._0_10_ =
                     CONCAT19((0 < sVar12) * (sVar12 < 0x100) * auVar55[2] - (0xff < sVar12),
                              CONCAT18(cVar7,uVar37));
                cVar8 = (0 < sVar13) * (sVar13 < 0x100) * auVar55[4] - (0xff < sVar13);
                auVar52[10] = cVar8;
                auVar52[0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar55[6] - (0xff < sVar14);
                cVar9 = (0 < sVar15) * (sVar15 < 0x100) * auVar55[8] - (0xff < sVar15);
                auVar53[0xc] = cVar9;
                auVar53._0_12_ = auVar52;
                auVar53[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar55[10] - (0xff < sVar16);
                cVar10 = (0 < sVar17) * (sVar17 < 0x100) * auVar55[0xc] - (0xff < sVar17);
                auVar56[0xe] = cVar10;
                auVar56._0_14_ = auVar53;
                auVar56[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar55[0xe] - (0xff < sVar18);
                sVar11 = (short)((uint)uVar50 >> 0x10);
                auVar54[1] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
                auVar54[0] = (0 < sVar49) * (sVar49 < 0x100) * cVar3 - (0xff < sVar49);
                sVar12 = (short)((uint6)uVar51 >> 0x20);
                auVar54[2] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                sVar13 = (short)((ulong)uVar37 >> 0x30);
                auVar54[3] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                sVar14 = (short)((unkuint10)auVar52._0_10_ >> 0x40);
                auVar54[4] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                sVar15 = auVar52._10_2_;
                auVar54[5] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                sVar16 = auVar53._12_2_;
                auVar54[6] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                sVar17 = auVar56._14_2_;
                auVar54[7] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                auVar54[8] = (0 < sVar49) * (sVar49 < 0x100) * cVar3 - (0xff < sVar49);
                auVar54[9] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
                auVar54[10] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                auVar54[0xb] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                auVar54[0xc] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                auVar54[0xd] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                auVar54[0xe] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                auVar54[0xf] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                auVar54 = auVar54 | (auVar62 | in_XMM2) & auVar65;
                uVar42 = uVar42 - 2;
                uVar36 = (ulong)((int)uVar36 + 2);
              } while (uVar42 != 2);
              *(uint *)(pdVar35->m_alpha + 4) = auVar54._0_4_;
            }
            else if (eVar1 == cAlphaDXT3) {
              x_00 = 0;
              do {
                y_00 = 0;
                do {
                  value = dxt3_block::get_alpha(this_00,x_00,y_00,false);
                  value_00 = dxt3_block::get_alpha(this_00,3 - x_00,y_00,false);
                  dxt3_block::set_alpha(this_00,x_00,y_00,value_00,false);
                  dxt3_block::set_alpha(this_00,3 - x_00,y_00,value,false);
                  y_00 = y_00 + 1;
                } while (y_00 != 4);
                x_00 = x_00 + 1;
                auVar67 = _DAT_001b0b70;
                auVar68 = _DAT_001ae030;
              } while (x_00 != 2);
            }
            else if (eVar1 == cAlphaDXT5) {
              iVar44 = 9;
              iVar40 = 0;
              iVar45 = 0;
              do {
                iVar46 = 0;
                do {
                  uVar47 = (uint)(iVar40 + iVar46) >> 3;
                  bVar38 = (byte)(iVar40 + iVar46) & 7;
                  uVar42 = iVar44 + iVar46;
                  uVar36 = (ulong)(uVar42 >> 3);
                  uVar48 = (uint)puVar43[uVar36];
                  if (uVar42 < 0x28) {
                    uVar48 = (uint)CONCAT11(puVar43[uVar36 + 1],puVar43[uVar36]);
                  }
                  bVar39 = (byte)uVar42 & 7;
                  uVar41 = (ushort)(CONCAT11((pdVar34->m_alpha + 3)[uVar47],puVar43[uVar47]) >>
                                   bVar38) & 7;
                  *(ushort *)(puVar43 + uVar47) =
                       (ushort)((uVar48 >> bVar39 & 7) << bVar38) |
                       ~(ushort)(7 << bVar38) &
                       CONCAT11((pdVar34->m_alpha + 3)[uVar47],puVar43[uVar47]);
                  if (uVar42 < 0x28) {
                    uVar42 = uVar41 << bVar39 |
                             ~(7 << bVar39) & (uint)CONCAT11(puVar43[uVar36 + 1],puVar43[uVar36]);
                    puVar43[uVar36 + 1] = (uint8)(uVar42 >> 8);
                  }
                  else {
                    uVar42 = uVar41 << bVar39 | (uint)puVar43[uVar36] & ~(7 << bVar39);
                  }
                  puVar43[uVar36] = (uint8)uVar42;
                  iVar46 = iVar46 + 0xc;
                } while (iVar46 != 0x30);
                iVar45 = iVar45 + 1;
                iVar44 = iVar44 + -3;
                iVar40 = iVar40 + 3;
              } while (iVar45 != 2);
            }
            this_00 = &local_60;
            pdVar34 = &local_60;
            pdVar35 = &local_60;
            uVar37 = 0;
            this = local_40;
          } while ((local_54 & 1) != 0);
          *&local_40->m_pElements
            [(local_40->m_blocks_x * (int)local_48 + (int)local_50) *
             local_40->m_num_elements_per_block + (int)local_38].m_bytes = local_60.m_alpha;
          *&local_40->m_pElements
            [(local_40->m_blocks_x * (int)local_48 + local_58) * local_40->m_num_elements_per_block
             + (int)local_38].m_bytes = local_68.m_alpha;
          local_38 = local_38 + 1;
          uVar48 = local_40->m_num_elements_per_block;
          uVar36 = (ulong)uVar48;
          uVar37 = local_50;
          iVar44 = local_58;
        } while (local_38 < uVar36);
        uVar42 = local_40->m_blocks_y;
      }
      uVar41 = (int)local_48 + 1;
      local_48 = (ulong)uVar41;
      uVar47 = uVar48;
    } while (uVar41 < uVar42);
  }
  return;
}

Assistant:

void dxt_image::flip_col(uint x)
    {
        const uint other_x = (m_blocks_x - 1) - x;
        for (uint y = 0; y < m_blocks_y; y++)
        {
            for (uint e = 0; e < get_elements_per_block(); e++)
            {
                element tmp[2] = { get_element(x, y, e), get_element(other_x, y, e) };

                for (uint i = 0; i < 2; i++)
                {
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp[i])->flip_x();
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp[i])->flip_x();
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp[i])->flip_x();
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                }

                get_element(x, y, e) = tmp[1];
                get_element(other_x, y, e) = tmp[0];
            }
        }
    }